

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

void __thiscall
fmt::v8::detail::format_dragon
          (detail *this,fp value,bool is_predecessor_closer,int num_digits,buffer<char> *buf,
          int *exp10)

{
  uint *puVar1;
  uint *puVar2;
  uint *puVar3;
  uint *puVar4;
  char *pcVar5;
  long lVar6;
  size_t sVar7;
  char cVar8;
  int iVar9;
  uint uVar10;
  undefined7 in_register_00000009;
  bigint *this_00;
  uint uVar11;
  long lVar12;
  undefined4 in_register_00000084;
  undefined8 *puVar13;
  ulong uVar14;
  int iVar15;
  bigint *lhs2;
  ulong uVar16;
  uint64_t value_00;
  bigint numerator;
  bigint denominator;
  bigint lower;
  bigint upper_store;
  bigint local_2f0;
  bigint local_240;
  bigint local_190;
  bigint local_e0;
  
  puVar13 = (undefined8 *)CONCAT44(in_register_00000084,num_digits);
  iVar9 = (int)value.f;
  local_2f0.bigits_.super_buffer<unsigned_int>.size_ = 0;
  local_2f0.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_001a2c20;
  puVar1 = local_2f0.bigits_.store_;
  local_2f0.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  local_2f0.exp_ = 0;
  local_240.bigits_.super_buffer<unsigned_int>.size_ = 0;
  local_240.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_001a2c20;
  puVar2 = local_240.bigits_.store_;
  local_240.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  local_240.exp_ = 0;
  local_190.bigits_.super_buffer<unsigned_int>.size_ = 0;
  local_190.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_001a2c20;
  puVar3 = local_190.bigits_.store_;
  local_190.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  local_190.exp_ = 0;
  this_00 = &local_e0;
  local_e0.bigits_.super_buffer<unsigned_int>.size_ = 0;
  local_e0.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_001a2c20;
  puVar4 = local_e0.bigits_.store_;
  local_e0.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  local_e0.exp_ = 0;
  iVar15 = value.e + 1;
  value_00 = (long)this << ((byte)iVar15 & 0x3f);
  cVar8 = (char)value.e;
  local_2f0.bigits_.super_buffer<unsigned_int>.ptr_ = puVar1;
  local_240.bigits_.super_buffer<unsigned_int>.ptr_ = puVar2;
  local_190.bigits_.super_buffer<unsigned_int>.ptr_ = puVar3;
  local_e0.bigits_.super_buffer<unsigned_int>.ptr_ = puVar4;
  if (iVar9 < 0) {
    if (*(int *)&buf->_vptr_buffer < 0) {
      bigint::assign_pow10(&local_2f0,-*(int *)&buf->_vptr_buffer);
      sVar7 = local_2f0.bigits_.super_buffer<unsigned_int>.size_;
      if (local_190.bigits_.super_buffer<unsigned_int>.capacity_ <
          local_2f0.bigits_.super_buffer<unsigned_int>.size_) {
        (**local_190.bigits_.super_buffer<unsigned_int>._vptr_buffer)
                  (&local_190,local_2f0.bigits_.super_buffer<unsigned_int>.size_);
      }
      local_190.bigits_.super_buffer<unsigned_int>.size_ =
           local_190.bigits_.super_buffer<unsigned_int>.capacity_;
      if (sVar7 <= local_190.bigits_.super_buffer<unsigned_int>.capacity_) {
        local_190.bigits_.super_buffer<unsigned_int>.size_ = sVar7;
      }
      if (sVar7 != 0) {
        memmove(local_190.bigits_.super_buffer<unsigned_int>.ptr_,
                local_2f0.bigits_.super_buffer<unsigned_int>.ptr_,sVar7 << 2);
      }
      sVar7 = local_2f0.bigits_.super_buffer<unsigned_int>.size_;
      local_190.exp_ = local_2f0.exp_;
      if (cVar8 == '\0') {
        this_00 = (bigint *)0x0;
      }
      else {
        if (local_e0.bigits_.super_buffer<unsigned_int>.capacity_ <
            local_2f0.bigits_.super_buffer<unsigned_int>.size_) {
          (**local_e0.bigits_.super_buffer<unsigned_int>._vptr_buffer)
                    (&local_e0,local_2f0.bigits_.super_buffer<unsigned_int>.size_);
        }
        local_e0.bigits_.super_buffer<unsigned_int>.size_ =
             local_e0.bigits_.super_buffer<unsigned_int>.capacity_;
        if (sVar7 <= local_e0.bigits_.super_buffer<unsigned_int>.capacity_) {
          local_e0.bigits_.super_buffer<unsigned_int>.size_ = sVar7;
        }
        if (sVar7 != 0) {
          memmove(local_e0.bigits_.super_buffer<unsigned_int>.ptr_,
                  local_2f0.bigits_.super_buffer<unsigned_int>.ptr_,sVar7 << 2);
        }
        this_00 = &local_e0;
        local_e0.exp_ = local_2f0.exp_;
        bigint::operator<<=(this_00,1);
      }
      bigint::multiply(&local_2f0,value_00);
      bigint::assign(&local_240,1);
      bigint::operator<<=(&local_240,iVar15 - iVar9);
    }
    else {
      bigint::assign(&local_2f0,value_00);
      bigint::assign_pow10(&local_240,*(int *)&buf->_vptr_buffer);
      bigint::operator<<=(&local_240,iVar15 - iVar9);
      bigint::assign(&local_190,1);
      if (cVar8 == '\0') {
        this_00 = (bigint *)0x0;
      }
      else {
        bigint::assign(this_00,2);
      }
    }
  }
  else {
    bigint::assign(&local_2f0,value_00);
    bigint::operator<<=(&local_2f0,iVar9);
    bigint::assign(&local_190,1);
    bigint::operator<<=(&local_190,iVar9);
    if (cVar8 == '\0') {
      this_00 = (bigint *)0x0;
    }
    else {
      this_00 = &local_e0;
      bigint::assign(this_00,1);
      bigint::operator<<=(this_00,iVar9 + 1);
    }
    bigint::assign_pow10(&local_240,*(int *)&buf->_vptr_buffer);
    bigint::operator<<=(&local_240,iVar15);
  }
  iVar9 = (int)CONCAT71(in_register_00000009,is_predecessor_closer);
  if (-1 < iVar9) {
    *(int *)&buf->_vptr_buffer = *(int *)&buf->_vptr_buffer - (iVar9 + -1);
    uVar11 = iVar9 - 1;
    if (iVar9 == 0) {
      bigint::multiply(&local_240,10);
      iVar9 = add_compare(&local_2f0,&local_2f0,&local_240);
      if ((ulong)puVar13[3] < puVar13[2] + 1) {
        (**(code **)*puVar13)(puVar13);
      }
      lVar6 = puVar13[2];
      puVar13[2] = lVar6 + 1;
      *(byte *)(puVar13[1] + lVar6) = 0 < iVar9 | 0x30;
    }
    else {
      uVar16 = CONCAT71(in_register_00000009,is_predecessor_closer) & 0xffffffff;
      if ((ulong)puVar13[3] < uVar16) {
        (**(code **)*puVar13)(puVar13,uVar16);
      }
      uVar14 = puVar13[3];
      if (uVar16 <= (ulong)puVar13[3]) {
        uVar14 = uVar16;
      }
      puVar13[2] = uVar14;
      if (1 < iVar9) {
        uVar14 = 0;
        do {
          iVar15 = bigint::divmod_assign(&local_2f0,&local_240);
          *(char *)(puVar13[1] + uVar14) = (char)iVar15 + '0';
          bigint::multiply(&local_2f0,10);
          uVar14 = uVar14 + 1;
        } while (uVar11 != uVar14);
      }
      uVar10 = bigint::divmod_assign(&local_2f0,&local_240);
      iVar15 = add_compare(&local_2f0,&local_2f0,&local_240);
      if ((0 < iVar15) || ((uVar10 & 1) != 0 && iVar15 == 0)) {
        if (uVar10 == 9) {
          *(undefined1 *)(puVar13[1] + (long)(int)uVar11) = 0x3a;
          if (1 < iVar9) {
            do {
              if (*(char *)(puVar13[1] + -1 + uVar16) != ':') break;
              *(undefined1 *)(puVar13[1] + -1 + uVar16) = 0x30;
              pcVar5 = (char *)(puVar13[1] + -2 + uVar16);
              *pcVar5 = *pcVar5 + '\x01';
              uVar16 = uVar16 - 1;
            } while (1 < (long)uVar16);
          }
          if (*(char *)puVar13[1] == ':') {
            *(char *)puVar13[1] = '1';
            *(int *)&buf->_vptr_buffer = *(int *)&buf->_vptr_buffer + 1;
          }
          goto LAB_00172673;
        }
        uVar10 = uVar10 + 1;
      }
      *(char *)(puVar13[1] + (long)(int)uVar11) = (char)uVar10 + '0';
    }
    goto LAB_00172673;
  }
  lhs2 = this_00;
  if (this_00 == (bigint *)0x0) {
    lhs2 = &local_190;
  }
  lVar6 = puVar13[1];
  uVar11 = ~(uint)this & 1;
  lVar12 = 0;
  while( true ) {
    uVar10 = bigint::divmod_assign(&local_2f0,&local_240);
    iVar9 = compare(&local_2f0,&local_190);
    iVar15 = add_compare(&local_2f0,lhs2,&local_240);
    *(char *)(lVar6 + lVar12) = (char)uVar10 + '0';
    if ((iVar9 < (int)uVar11) || ((int)-uVar11 < iVar15)) break;
    bigint::multiply(&local_2f0,10);
    bigint::multiply(&local_190,10);
    if (this_00 != (bigint *)0x0) {
      bigint::multiply(lhs2,10);
    }
    lVar12 = lVar12 + 1;
  }
  if (iVar9 < (int)uVar11) {
    if ((int)-uVar11 < iVar15) {
      iVar9 = add_compare(&local_2f0,&local_2f0,&local_240);
      if ((0 < iVar9) || ((uVar10 & 1) != 0 && iVar9 == 0)) {
        cVar8 = *(char *)(lVar6 + lVar12) + '\x01';
        goto LAB_0017251a;
      }
    }
  }
  else {
    cVar8 = (char)uVar10 + '1';
LAB_0017251a:
    *(char *)(lVar6 + lVar12) = cVar8;
  }
  uVar16 = lVar12 + 1U & 0xffffffff;
  if ((ulong)puVar13[3] < uVar16) {
    (**(code **)*puVar13)(puVar13,uVar16);
  }
  if ((ulong)puVar13[3] < uVar16) {
    uVar16 = puVar13[3];
  }
  puVar13[2] = uVar16;
  *(int *)&buf->_vptr_buffer = *(int *)&buf->_vptr_buffer - (int)lVar12;
LAB_00172673:
  if (local_e0.bigits_.super_buffer<unsigned_int>.ptr_ != puVar4) {
    operator_delete(local_e0.bigits_.super_buffer<unsigned_int>.ptr_,
                    local_e0.bigits_.super_buffer<unsigned_int>.capacity_ << 2);
  }
  if (local_190.bigits_.super_buffer<unsigned_int>.ptr_ != puVar3) {
    operator_delete(local_190.bigits_.super_buffer<unsigned_int>.ptr_,
                    local_190.bigits_.super_buffer<unsigned_int>.capacity_ << 2);
  }
  if (local_240.bigits_.super_buffer<unsigned_int>.ptr_ != puVar2) {
    operator_delete(local_240.bigits_.super_buffer<unsigned_int>.ptr_,
                    local_240.bigits_.super_buffer<unsigned_int>.capacity_ << 2);
  }
  if (local_2f0.bigits_.super_buffer<unsigned_int>.ptr_ != puVar1) {
    operator_delete(local_2f0.bigits_.super_buffer<unsigned_int>.ptr_,
                    local_2f0.bigits_.super_buffer<unsigned_int>.capacity_ << 2);
  }
  return;
}

Assistant:

FMT_CONSTEXPR20 inline void format_dragon(fp value, bool is_predecessor_closer,
                                          int num_digits, buffer<char>& buf,
                                          int& exp10) {
  bigint numerator;    // 2 * R in (FPP)^2.
  bigint denominator;  // 2 * S in (FPP)^2.
  // lower and upper are differences between value and corresponding boundaries.
  bigint lower;             // (M^- in (FPP)^2).
  bigint upper_store;       // upper's value if different from lower.
  bigint* upper = nullptr;  // (M^+ in (FPP)^2).
  // Shift numerator and denominator by an extra bit or two (if lower boundary
  // is closer) to make lower and upper integers. This eliminates multiplication
  // by 2 during later computations.
  int shift = is_predecessor_closer ? 2 : 1;
  uint64_t significand = value.f << shift;
  if (value.e >= 0) {
    numerator.assign(significand);
    numerator <<= value.e;
    lower.assign(1);
    lower <<= value.e;
    if (shift != 1) {
      upper_store.assign(1);
      upper_store <<= value.e + 1;
      upper = &upper_store;
    }
    denominator.assign_pow10(exp10);
    denominator <<= shift;
  } else if (exp10 < 0) {
    numerator.assign_pow10(-exp10);
    lower.assign(numerator);
    if (shift != 1) {
      upper_store.assign(numerator);
      upper_store <<= 1;
      upper = &upper_store;
    }
    numerator *= significand;
    denominator.assign(1);
    denominator <<= shift - value.e;
  } else {
    numerator.assign(significand);
    denominator.assign_pow10(exp10);
    denominator <<= shift - value.e;
    lower.assign(1);
    if (shift != 1) {
      upper_store.assign(1ULL << 1);
      upper = &upper_store;
    }
  }
  // Invariant: value == (numerator / denominator) * pow(10, exp10).
  if (num_digits < 0) {
    // Generate the shortest representation.
    if (!upper) upper = &lower;
    bool even = (value.f & 1) == 0;
    num_digits = 0;
    char* data = buf.data();
    for (;;) {
      int digit = numerator.divmod_assign(denominator);
      bool low = compare(numerator, lower) - even < 0;  // numerator <[=] lower.
      // numerator + upper >[=] pow10:
      bool high = add_compare(numerator, *upper, denominator) + even > 0;
      data[num_digits++] = static_cast<char>('0' + digit);
      if (low || high) {
        if (!low) {
          ++data[num_digits - 1];
        } else if (high) {
          int result = add_compare(numerator, numerator, denominator);
          // Round half to even.
          if (result > 0 || (result == 0 && (digit % 2) != 0))
            ++data[num_digits - 1];
        }
        buf.try_resize(to_unsigned(num_digits));
        exp10 -= num_digits - 1;
        return;
      }
      numerator *= 10;
      lower *= 10;
      if (upper != &lower) *upper *= 10;
    }
  }
  // Generate the given number of digits.
  exp10 -= num_digits - 1;
  if (num_digits == 0) {
    denominator *= 10;
    auto digit = add_compare(numerator, numerator, denominator) > 0 ? '1' : '0';
    buf.push_back(digit);
    return;
  }
  buf.try_resize(to_unsigned(num_digits));
  for (int i = 0; i < num_digits - 1; ++i) {
    int digit = numerator.divmod_assign(denominator);
    buf[i] = static_cast<char>('0' + digit);
    numerator *= 10;
  }
  int digit = numerator.divmod_assign(denominator);
  auto result = add_compare(numerator, numerator, denominator);
  if (result > 0 || (result == 0 && (digit % 2) != 0)) {
    if (digit == 9) {
      const auto overflow = '0' + 10;
      buf[num_digits - 1] = overflow;
      // Propagate the carry.
      for (int i = num_digits - 1; i > 0 && buf[i] == overflow; --i) {
        buf[i] = '0';
        ++buf[i - 1];
      }
      if (buf[0] == overflow) {
        buf[0] = '1';
        ++exp10;
      }
      return;
    }
    ++digit;
  }
  buf[num_digits - 1] = static_cast<char>('0' + digit);
}